

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalAndLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_logicaland(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LogicalAndLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_logicaland(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicaland(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LogicalAndLayerParams>(arena);
    (this->layer_).logicaland_ = pLVar2;
  }
  return (LogicalAndLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalAndLayerParams* NeuralNetworkLayer::_internal_mutable_logicaland() {
  if (!_internal_has_logicaland()) {
    clear_layer();
    set_has_logicaland();
    layer_.logicaland_ = CreateMaybeMessage< ::CoreML::Specification::LogicalAndLayerParams >(GetArenaForAllocation());
  }
  return layer_.logicaland_;
}